

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void xLearn::PrecMetric::prec_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,index_t *true_pos,index_t *false_pos,size_t start_idx,size_t end_idx)

{
  int iVar1;
  ostream *poVar2;
  ostream *poVar3;
  const_reference pvVar4;
  int *in_RCX;
  int *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  ulong in_R8;
  ulong in_R9;
  float fVar5;
  real_t r_label;
  real_t p_label;
  size_t i;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string local_90 [4];
  LogSeverity in_stack_ffffffffffffff74;
  allocator local_59;
  string local_58 [36];
  Logger local_34;
  ulong local_30;
  ulong local_28;
  int *local_20;
  int *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_30 = in_R9;
  if (in_R8 <= in_R9) {
    *in_RDX = 0;
    *in_RCX = 0;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    for (; in_R8 < local_30; in_R8 = in_R8 + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_10,in_R8);
      iVar1 = -1;
      if (0.0 < *pvVar4) {
        iVar1 = 1;
      }
      fVar5 = (float)iVar1;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_8,in_R8);
      iVar1 = -1;
      if (0.0 < *pvVar4) {
        iVar1 = 1;
      }
      if ((fVar5 <= 0.0) || ((float)iVar1 <= 0.0)) {
        if ((0.0 < fVar5) && ((float)iVar1 < 0.0)) {
          *local_20 = *local_20 + 1;
        }
      }
      else {
        *local_18 = *local_18 + 1;
      }
    }
    return;
  }
  local_28 = in_R8;
  Logger::Logger(&local_34,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
             ,&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"prec_accum_thread",(allocator *)&stack0xffffffffffffff6f);
  poVar2 = Logger::Start(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,iVar1,
                         (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  poVar2 = std::operator<<(poVar2,"CHECK_GE failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xcb);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"end_idx");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"start_idx");
  poVar3 = std::operator<<(poVar2," = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  Logger::~Logger((Logger *)poVar2);
  abort();
}

Assistant:

static void prec_accum_thread(const std::vector<real_t>* Y,
                                const std::vector<real_t>* pred,
                                index_t* true_pos,
                                index_t* false_pos,
                                size_t start_idx,
                                size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *true_pos = 0;
    *false_pos = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t p_label = (*pred)[i] > 0 ? 1 : -1;
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      if (p_label > 0 && r_label > 0) {
        (*true_pos)++;
      } else if (p_label > 0 && r_label < 0) {
        (*false_pos)++;
      }
    }
  }